

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.h
# Opt level: O3

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type::Enum>
          (TypeChecker *this,Result result,char *desc,Enum args)

{
  pointer pTVar1;
  Type TVar2;
  TypeVector local_38;
  
  if (result.enum_ == Error) {
    if (args == Reference) {
      __assert_fail("!EnumIsReferenceWithIndex(enum_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/type.h"
                    ,0x43,"wabt::Type::Type(Enum)");
    }
    pTVar1 = (pointer)operator_new(8);
    local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar1 + 1;
    TVar2.type_index_ = 0;
    TVar2.enum_ = args;
    *pTVar1 = TVar2;
    local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = pTVar1;
    local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    PrintStackIfFailedV(this,(Result)0x1,desc,&local_38,false);
    operator_delete(pTVar1,8);
  }
  return;
}

Assistant:

explicit TypeChecker(const Features& features) : features_(features) {}